

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_f0;
  char *pcStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  AString rep;
  AString old;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 7;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14327a;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"xy012xy",8);
  old.buffer = (char *)0x0;
  old.reallocator._0_4_ = 0x11e238;
  old.reallocator._4_4_ = 0;
  old.deallocator._0_4_ = 0x11e278;
  old.deallocator._4_4_ = 0;
  old.size = 2;
  old.capacity = 2;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x1432e4;
  old.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,3);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  old.buffer[2] = '\0';
  old.buffer[0] = 'x';
  old.buffer[1] = 'y';
  rep.buffer = (char *)0x0;
  rep.reallocator._0_4_ = 0x11e238;
  rep.reallocator._4_4_ = 0;
  rep.deallocator._0_4_ = 0x11e278;
  rep.deallocator._4_4_ = 0;
  rep.size = 3;
  rep.capacity = 3;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x143344;
  rep.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,4);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(rep.buffer,"abc",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14337a;
  bVar1 = AString_replaceAString(&string,&old,&rep,0);
  if (bVar1 == false) {
    uStack_c0 = 0x1435bc;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x809,"Assertion \'AString_replaceAString(&string, &old, &rep, 0)\' failed",0
                      ,0);
  }
  uStack_c0 = 0x143393;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x809);
  if (string.capacity != 0x10) {
    pcStack_d0 = "(16)";
    pcVar6 = "(string).capacity == (16)";
    pcVar7 = "(string).capacity";
    iVar2 = 0x80a;
    local_c8 = (char *)0x10;
    pcVar8 = (char *)string.capacity;
    goto LAB_001438f5;
  }
  uStack_c0 = 0x1433b3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x80a);
  if (string.buffer == (char *)0x0) {
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar6 = "(void*) (string).buffer";
    iVar2 = 0x80a;
LAB_0014381d:
    uStack_c0 = 0;
    local_c8 = (char *)0x0;
    pcStack_d0 = (char *)0x143824;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar8,pcVar6);
  }
  uStack_c0 = 0x1433d3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x80a);
  pcVar4 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar4 = "(null)";
LAB_00143645:
    pcStack_d0 = "abc012abc";
    pcStack_e0 = "(\"abc012abc\")";
    pcVar6 = "(string).buffer == (\"abc012abc\")";
    pcVar7 = "(string).buffer";
    iVar2 = 0x80a;
  }
  else {
    uStack_c0 = 0x1433f3;
    iVar2 = strcmp("abc012abc",string.buffer);
    if (iVar2 != 0) {
      pcVar8 = "\"";
      goto LAB_00143645;
    }
    uStack_c0 = 0x14340c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x80a);
    if (string.size != 9) {
      pcStack_d0 = "strlen(\"abc012abc\")";
      pcVar6 = "(string).size == strlen(\"abc012abc\")";
      pcVar7 = "(string).size";
      iVar2 = 0x80a;
      local_c8 = (char *)0x9;
      pcVar8 = (char *)string.size;
LAB_001438f5:
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      ppcVar5 = &pcStack_d0;
      goto LAB_001438f7;
    }
    uStack_c0 = 0x14342c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x80a);
    if (old.capacity != 2) {
      pcStack_d0 = "(2)";
      pcVar6 = "(old).capacity == (2)";
      pcVar7 = "(old).capacity";
      pcVar8 = (char *)old.capacity;
LAB_001437ab:
      iVar2 = 0x80b;
      local_c8 = (char *)0x2;
      goto LAB_001438f5;
    }
    uStack_c0 = 0x14344c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x80b);
    if (old.buffer == (char *)0x0) {
      pcVar8 = "(void*) (old).buffer != NULL";
      pcVar6 = "(void*) (old).buffer";
      iVar2 = 0x80b;
      goto LAB_0014381d;
    }
    uStack_c0 = 0x143469;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x80b);
    pcVar4 = old.buffer;
    if (old.buffer == (char *)0x0) {
      pcVar8 = "";
      pcVar4 = "(null)";
LAB_0014373f:
      pcStack_d0 = "xy";
      pcStack_e0 = "(\"xy\")";
      pcVar6 = "(old).buffer == (\"xy\")";
      pcVar7 = "(old).buffer";
      iVar2 = 0x80b;
    }
    else {
      uStack_c0 = 0x143486;
      iVar2 = strcmp("xy",old.buffer);
      if (iVar2 != 0) {
        pcVar8 = "\"";
        goto LAB_0014373f;
      }
      uStack_c0 = 0x14349f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80b);
      if (old.size != 2) {
        pcStack_d0 = "strlen(\"xy\")";
        pcVar6 = "(old).size == strlen(\"xy\")";
        pcVar7 = "(old).size";
        pcVar8 = (char *)old.size;
        goto LAB_001437ab;
      }
      uStack_c0 = 0x1434bf;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80b);
      if (rep.capacity != 3) {
        pcStack_d0 = "(3)";
        pcVar6 = "(rep).capacity == (3)";
        pcVar7 = "(rep).capacity";
        pcVar8 = (char *)rep.capacity;
LAB_001438b3:
        iVar2 = 0x80c;
        local_c8 = (char *)0x3;
        goto LAB_001438f5;
      }
      uStack_c0 = 0x1434df;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80c);
      if (rep.buffer == (char *)0x0) {
        pcVar8 = "(void*) (rep).buffer != NULL";
        pcVar6 = "(void*) (rep).buffer";
        iVar2 = 0x80c;
        goto LAB_0014381d;
      }
      uStack_c0 = 0x1434fc;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80c);
      pcVar4 = rep.buffer;
      if (rep.buffer == (char *)0x0) {
        pcVar4 = "(null)";
        pcVar8 = "";
      }
      else {
        uStack_c0 = 0x143519;
        iVar2 = strcmp("abc",rep.buffer);
        if (iVar2 == 0) {
          uStack_c0 = 0x143532;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80c);
          if (rep.size == 3) {
            uStack_c0 = 0x143552;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x80c);
            if (private_ACUtilsTest_AString_reallocCount == 1) {
              uStack_c0 = 0x143574;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80d);
              uStack_c0 = 0x143580;
              (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
              uStack_c0 = 0x143589;
              (*(code *)CONCAT44(old.deallocator._4_4_,old.deallocator._0_4_))(old.buffer);
              uStack_c0 = 0x143592;
              (*(code *)CONCAT44(rep.deallocator._4_4_,rep.deallocator._0_4_))(rep.buffer);
              return;
            }
            pcStack_d0 = "(1)";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount == (1)";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x80d;
            local_c8 = (char *)0x1;
            pcVar8 = (char *)private_ACUtilsTest_AString_reallocCount;
            goto LAB_001438f5;
          }
          pcStack_d0 = "strlen(\"abc\")";
          pcVar6 = "(rep).size == strlen(\"abc\")";
          pcVar7 = "(rep).size";
          pcVar8 = (char *)rep.size;
          goto LAB_001438b3;
        }
        pcVar8 = "\"";
      }
      pcStack_d0 = "abc";
      pcStack_e0 = "(\"abc\")";
      pcVar6 = "(rep).buffer == (\"abc\")";
      pcVar7 = "(rep).buffer";
      iVar2 = 0x80c;
    }
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_c8 = "\"";
  pcStack_d8 = "\"";
  ppcVar5 = &pcStack_f0;
  pcStack_f0 = pcVar4;
  pcStack_e8 = pcVar8;
LAB_001438f7:
  uStack_c0 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_replaceAString_success_oldBiggerLengthThanRep_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xy012xy", 8);
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceAString(&string, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abc012abc", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}